

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

ParamGenerator<int> gtest_rtripFilesrtripProblems_EvalGenerator_(void)

{
  testing *in_RDI;
  ParamGenerator<int> PVar1;
  
  PVar1 = testing::Range<int>(in_RDI,1,0x26);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)in_RDI;
  return (ParamGenerator<int>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

TEST(fuzzFailures, rtripSingleProblems)
{
    auto cdata = loadFailureFile("rtrip_fail", 37);
    auto u1 = unit_from_string(cdata);
    if (!is_error(u1)) {
        auto str = to_string(u1);
        std::cout << str << std::endl;
        auto u2 = unit_from_string(str);
        EXPECT_FALSE(is_error(u2));
        if (u2 == u1) {
            EXPECT_EQ(u2, u1);
            EXPECT_EQ(unit_cast(u2), unit_cast(u1));
            EXPECT_FALSE(units::unit_cast(u2) != units::unit_cast(u1));
        } else if (!is_error(root(u2, 2))) {
            EXPECT_EQ(root(unit_cast(u2), 2), root(unit_cast(u1), 2));
            EXPECT_FALSE(
                root(units::unit_cast(u2), 2) != root(units::unit_cast(u1), 2));
        } else if (!is_error(root(u2, 3))) {
            EXPECT_EQ(root(unit_cast(u2), 3), root(unit_cast(u1), 3));
            EXPECT_FALSE(
                root(units::unit_cast(u2), 3) != root(units::unit_cast(u1), 3));
        } else {
            auto uc1 = unit_cast(u1);
            auto uc2 = unit_cast(u2);
            EXPECT_EQ(uc2, uc1);
            EXPECT_FALSE(uc2 != uc1);
        }
    }
}